

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

void extent_deactivate_locked_impl(tsdn_t *tsdn,pac_t *pac,ecache_t *ecache,edata_t *edata)

{
  eset_t *eset;
  
  duckdb_je_emap_update_edata_state(tsdn,pac->emap,edata,ecache->state);
  eset = &ecache->eset;
  if (((uint)edata->e_bits >> 0x10 & 1) != 0) {
    eset = &ecache->guarded_eset;
  }
  duckdb_je_eset_insert(eset,edata);
  return;
}

Assistant:

static void
extent_deactivate_locked_impl(tsdn_t *tsdn, pac_t *pac, ecache_t *ecache,
    edata_t *edata) {
	malloc_mutex_assert_owner(tsdn, &ecache->mtx);
	assert(edata_arena_ind_get(edata) == ecache_ind_get(ecache));

	emap_update_edata_state(tsdn, pac->emap, edata, ecache->state);
	eset_t *eset = edata_guarded_get(edata) ? &ecache->guarded_eset :
	    &ecache->eset;
	eset_insert(eset, edata);
}